

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::TextureVkImpl::CreateViewInternal
          (TextureVkImpl *this,TextureViewDesc *ViewDesc,ITextureView **ppView,bool bIsDefaultView)

{
  TextureViewVkImpl *this_00;
  FixedBlockMemoryAllocator *pFVar1;
  bool bIsDefaultView_local;
  string msg;
  string msg_3;
  ImageViewWrapper ImgView;
  TextureVkImpl *local_30;
  RenderDeviceVkImpl *local_28;
  
  bIsDefaultView_local = bIsDefaultView;
  if (ppView == (ITextureView **)0x0) {
    FormatString<char[29]>(&msg,(char (*) [29])"View pointer address is null");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x2b9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (*ppView != (ITextureView *)0x0) {
      FormatString<char[64]>
                (&msg,(char (*) [64])
                      "Overwriting reference to existing object may cause memory leaks");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,699);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    *ppView = (ITextureView *)0x0;
    pFVar1 = &(((this->super_TextureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
               .m_pDevice)->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_TexViewObjAllocator;
    if (pFVar1 != (this->super_TextureBase<Diligent::EngineVkImplTraits>).m_dbgTexViewObjAllocator)
    {
      FormatString<char[87]>
                (&msg,(char (*) [87])
                      "Texture view allocator does not match allocator provided during texture initialization"
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x2c2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    msg._M_dataplus._M_p = (ViewDesc->super_DeviceObjectAttribs).Name;
    msg._M_string_length._0_1_ = ViewDesc->ViewType;
    msg._M_string_length._1_1_ = ViewDesc->TextureDim;
    msg._M_string_length._2_2_ = ViewDesc->Format;
    msg._M_string_length._4_4_ = ViewDesc->MostDetailedMip;
    msg.field_2._0_4_ = ViewDesc->NumMipLevels;
    msg.field_2._4_4_ = ViewDesc->field_5;
    msg.field_2._8_4_ = ViewDesc->field_6;
    msg.field_2._12_1_ = ViewDesc->AccessFlags;
    msg.field_2._13_1_ = ViewDesc->Flags;
    msg.field_2._14_1_ = (ViewDesc->Swizzle).R;
    msg.field_2._15_1_ = (ViewDesc->Swizzle).G;
    ValidatedAndCorrectTextureViewDesc
              (&(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                .m_Desc,(TextureViewDesc *)&msg);
    CreateImageView(&ImgView,this,(TextureViewDesc *)&msg);
    msg_3._M_string_length = (size_type)(TextureVkImpl *)0x0;
    if (bIsDefaultView_local != false) {
      msg_3._M_string_length = (size_type)this;
    }
    msg_3.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_5f5050;
    msg_3.field_2._8_8_ = anon_var_dwarf_5f4c69;
    msg_3._M_dataplus._M_p = (pointer)pFVar1;
    local_28 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
               ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                            *)this);
    local_30 = this;
    this_00 = MakeNewRCObj<Diligent::TextureViewVkImpl,Diligent::FixedBlockMemoryAllocator>::
              operator()((MakeNewRCObj<Diligent::TextureViewVkImpl,Diligent::FixedBlockMemoryAllocator>
                          *)&msg_3,&local_28,(TextureViewDesc *)&msg,&local_30,&ImgView,
                         &bIsDefaultView_local);
    if ((this_00->super_TextureViewBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
        .m_Desc.ViewType != ViewDesc->ViewType) {
      FormatString<char[20]>(&msg_3,(char (*) [20])"Incorrect view type");
      DebugAssertionFailed
                (msg_3._M_dataplus._M_p,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x2c9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg_3._M_dataplus._M_p != &msg_3.field_2) {
        operator_delete(msg_3._M_dataplus._M_p,msg_3.field_2._M_allocated_capacity + 1);
      }
    }
    if (bIsDefaultView_local == true) {
      *ppView = (ITextureView *)this_00;
    }
    else {
      TextureViewVkImpl::QueryInterface(this_00,(INTERFACE_ID *)IID_TextureView,(IObject **)ppView);
    }
    VulkanUtilities::VulkanObjectWrapper<VkImageView_T_*,_(VulkanUtilities::VulkanHandleTypeId)5>::
    ~VulkanObjectWrapper(&ImgView);
  }
  return;
}

Assistant:

void TextureVkImpl::CreateViewInternal(const TextureViewDesc& ViewDesc, ITextureView** ppView, bool bIsDefaultView)
{
    VERIFY(ppView != nullptr, "View pointer address is null");
    if (!ppView) return;
    VERIFY(*ppView == nullptr, "Overwriting reference to existing object may cause memory leaks");

    *ppView = nullptr;

    try
    {
        FixedBlockMemoryAllocator& TexViewAllocator = m_pDevice->GetTexViewObjAllocator();
        VERIFY(&TexViewAllocator == &m_dbgTexViewObjAllocator, "Texture view allocator does not match allocator provided during texture initialization");

        TextureViewDesc UpdatedViewDesc = ViewDesc;
        ValidatedAndCorrectTextureViewDesc(m_Desc, UpdatedViewDesc);

        VulkanUtilities::ImageViewWrapper ImgView = CreateImageView(UpdatedViewDesc);
        TextureViewVkImpl*                pViewVk = NEW_RC_OBJ(TexViewAllocator, "TextureViewVkImpl instance", TextureViewVkImpl, bIsDefaultView ? this : nullptr)(GetDevice(), UpdatedViewDesc, this, std::move(ImgView), bIsDefaultView);
        VERIFY(pViewVk->GetDesc().ViewType == ViewDesc.ViewType, "Incorrect view type");

        if (bIsDefaultView)
            *ppView = pViewVk;
        else
            pViewVk->QueryInterface(IID_TextureView, reinterpret_cast<IObject**>(ppView));
    }
    catch (const std::runtime_error&)
    {
        const char* ViewTypeName = GetTexViewTypeLiteralName(ViewDesc.ViewType);
        LOG_ERROR("Failed to create view \"", ViewDesc.Name ? ViewDesc.Name : "", "\" (", ViewTypeName, ") for texture \"", m_Desc.Name ? m_Desc.Name : "", "\"");
    }
}